

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_join.cpp
# Opt level: O1

unique_ptr<duckdb::JoinFilterGlobalState,_std::default_delete<duckdb::JoinFilterGlobalState>,_true>
__thiscall
duckdb::JoinFilterPushdownInfo::GetGlobalState
          (JoinFilterPushdownInfo *this,ClientContext *context,PhysicalOperator *op)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  GlobalUngroupedAggregateState *pGVar2;
  DynamicTableFilterSet *this_00;
  pointer puVar3;
  Allocator *client_allocator;
  GlobalUngroupedAggregateState *pGVar4;
  default_delete<duckdb::GlobalUngroupedAggregateState> *this_01;
  PhysicalOperator *in_RCX;
  pointer *__ptr_2;
  pointer *__ptr;
  JoinFilterPushdownFilter *info;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  GlobalUngroupedAggregateState *local_38;
  
  p_Var1 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&context->interrupted;
  for (this_02 = (context->db).internal.
                 super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi; this_02 != p_Var1;
      this_02 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&this_02[2]._M_use_count) {
    this_00 = shared_ptr<duckdb::DynamicTableFilterSet,_true>::operator->
                        ((shared_ptr<duckdb::DynamicTableFilterSet,_true> *)this_02);
    DynamicTableFilterSet::ClearFilters(this_00,in_RCX);
  }
  puVar3 = (pointer)operator_new(8);
  *puVar3 = 0;
  (this->join_condition).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = puVar3;
  client_allocator = BufferAllocator::Get((ClientContext *)op);
  pGVar4 = (GlobalUngroupedAggregateState *)operator_new(0xe8);
  GlobalUngroupedAggregateState::GlobalUngroupedAggregateState
            (pGVar4,client_allocator,
             (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              *)&context->logger);
  local_38 = pGVar4;
  this_01 = (default_delete<duckdb::GlobalUngroupedAggregateState> *)
            unique_ptr<duckdb::JoinFilterGlobalState,_std::default_delete<duckdb::JoinFilterGlobalState>,_true>
            ::operator->((unique_ptr<duckdb::JoinFilterGlobalState,_std::default_delete<duckdb::JoinFilterGlobalState>,_true>
                          *)this);
  pGVar2 = local_38;
  local_38 = (GlobalUngroupedAggregateState *)0x0;
  pGVar4 = *(GlobalUngroupedAggregateState **)this_01;
  *(GlobalUngroupedAggregateState **)this_01 = pGVar2;
  if (pGVar4 != (GlobalUngroupedAggregateState *)0x0) {
    ::std::default_delete<duckdb::GlobalUngroupedAggregateState>::operator()(this_01,pGVar4);
  }
  if (local_38 != (GlobalUngroupedAggregateState *)0x0) {
    ::std::default_delete<duckdb::GlobalUngroupedAggregateState>::operator()
              ((default_delete<duckdb::GlobalUngroupedAggregateState> *)&local_38,local_38);
  }
  return (unique_ptr<duckdb::JoinFilterGlobalState,_std::default_delete<duckdb::JoinFilterGlobalState>_>
          )(unique_ptr<duckdb::JoinFilterGlobalState,_std::default_delete<duckdb::JoinFilterGlobalState>_>
            )this;
}

Assistant:

unique_ptr<JoinFilterGlobalState> JoinFilterPushdownInfo::GetGlobalState(ClientContext &context,
                                                                         const PhysicalOperator &op) const {
	// clear any previously set filters
	// we can have previous filters for this operator in case of e.g. recursive CTEs
	for (auto &info : probe_info) {
		info.dynamic_filters->ClearFilters(op);
	}
	auto result = make_uniq<JoinFilterGlobalState>();
	result->global_aggregate_state =
	    make_uniq<GlobalUngroupedAggregateState>(BufferAllocator::Get(context), min_max_aggregates);
	return result;
}